

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.c
# Opt level: O0

int verify_descriptor_multi(miniscript_node_t *node,miniscript_node_t *parent)

{
  miniscript_node_t *pmVar1;
  uint uVar2;
  uint32_t count;
  uint32_t require_num;
  miniscript_node_t *key;
  miniscript_node_t *top;
  miniscript_node_t *parent_local;
  miniscript_node_t *node_local;
  
  uVar2 = get_child_list_count(node);
  if ((uVar2 < 2) || (0x14 < uVar2 - 1)) {
    node_local._4_4_ = -2;
  }
  else {
    pmVar1 = node->child;
    if ((((pmVar1->next == (miniscript_node_t *)0x0) || (pmVar1->info != (miniscript_item_t *)0x0))
        || (pmVar1->kind != 8)) || ((pmVar1->number < 1 || (uVar2 < (uint)pmVar1->number)))) {
      node_local._4_4_ = -2;
    }
    else {
      for (_count = pmVar1->next; _count != (miniscript_node_t *)0x0; _count = _count->next) {
        if ((_count->info != (miniscript_item_t *)0x0) || ((_count->kind & 0x20U) == 0)) {
          return -2;
        }
      }
      node->type_properties = node->info->type_properties;
      node_local._4_4_ = 0;
    }
  }
  return node_local._4_4_;
}

Assistant:

static int verify_descriptor_multi(struct miniscript_node_t *node, struct miniscript_node_t *parent)
{
    struct miniscript_node_t *top = NULL;
    struct miniscript_node_t *key = NULL;
    uint32_t require_num = 0;
    uint32_t count = (uint32_t) get_child_list_count(node);
    (void)parent;

    if ((count < 2) || (count - 1 > DESCRIPTOR_MINISCRIPT_MUILTI_MAX))
        return WALLY_EINVAL;

    top = node->child;
    require_num = (uint32_t) top->number;
    if (!top->next || top->info || (top->kind != DESCRIPTOR_KIND_NUMBER) ||
        (top->number <= 0) || (count < require_num))
        return WALLY_EINVAL;

    key = top->next;
    while (key) {
        if (key->info || !(key->kind & DESCRIPTOR_KIND_KEY))
            return WALLY_EINVAL;

        key = key->next;
    }

    node->type_properties = node->info->type_properties;
    return WALLY_OK;
}